

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::HasPackageReferences(cmGeneratorTarget *this)

{
  bool bVar1;
  string *psVar2;
  allocator<char> local_31;
  string local_30;
  
  bVar1 = IsInBuildSystem(this);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"VS_PACKAGE_REFERENCES",&local_31);
    psVar2 = (string *)GetProperty(this,&local_30);
    if (psVar2 == (string *)0x0) {
      psVar2 = &cmValue::Empty_abi_cxx11_;
    }
    bVar1 = psVar2->_M_string_length != 0;
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::HasPackageReferences() const
{
  return this->IsInBuildSystem() &&
    !this->GetProperty("VS_PACKAGE_REFERENCES")->empty();
}